

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_add(BtorSimBitVector *a,BtorSimBitVector *b)

{
  long lVar1;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  uint32_t carry;
  BtorSimBitVector *res;
  uint64_t sum;
  uint64_t y;
  uint64_t x;
  int64_t i;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  uint uVar2;
  BtorSimBitVector *local_38;
  ulong local_18;
  
  if (in_RDI->width < 0x41) {
    btorsim_bv_to_uint64(in_RDI);
    btorsim_bv_to_uint64(in_RSI);
    local_38 = btorsim_bv_uint64_to_bv
                         (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
  }
  else {
    local_38 = btorsim_bv_new(in_stack_ffffffffffffffc4);
    uVar2 = 0;
    for (local_18 = (ulong)(in_RDI->len - 1); -1 < (long)local_18; local_18 = local_18 - 1) {
      lVar1 = (ulong)(&in_RDI[1].width)[local_18] + (ulong)(&in_RSI[1].width)[local_18] +
              (ulong)uVar2;
      (&local_38[1].width)[local_18] = (uint32_t)lVar1;
      uVar2 = (uint)((ulong)lVar1 >> 0x20);
    }
  }
  set_rem_bits_to_zero(local_38);
  return local_38;
}

Assistant:

BtorSimBitVector *
btorsim_bv_add (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  uint64_t x, y, sum;
  BtorSimBitVector *res;
  BTORSIM_BV_TYPE carry;

  if (a->width <= 64)
  {
    x   = btorsim_bv_to_uint64 (a);
    y   = btorsim_bv_to_uint64 (b);
    res = btorsim_bv_uint64_to_bv (x + y, a->width);
  }
  else
  {
    res   = btorsim_bv_new (a->width);
    carry = 0;
    for (i = a->len - 1; i >= 0; i--)
    {
      sum          = (uint64_t) a->bits[i] + b->bits[i] + carry;
      res->bits[i] = (BTORSIM_BV_TYPE) sum;
      carry        = (BTORSIM_BV_TYPE) (sum >> 32);
    }
  }

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}